

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O0

int wally_wif_to_address(char *wif,uint32_t prefix,uint32_t version,char **output)

{
  size_t local_a0;
  size_t written;
  uchar address [21];
  uchar local_78 [8];
  uchar pubkey [65];
  int ret;
  char **output_local;
  uint32_t version_local;
  uint32_t prefix_local;
  char *wif_local;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((((wif == (char *)0x0) || ((prefix & 0xffffff00) != 0)) || ((version & 0xffffff00) != 0)) ||
     (output == (char **)0x0)) {
    wif_local._4_4_ = -2;
  }
  else {
    wif_local._4_4_ = wally_wif_to_public_key(wif,prefix,local_78,0x41,&local_a0);
    if (wif_local._4_4_ == 0) {
      written._0_1_ = (undefined1)version;
      wif_local._4_4_ = wally_hash160(local_78,local_a0,(uchar *)((long)&written + 1),0x14);
      if (wif_local._4_4_ == 0) {
        wif_local._4_4_ = wally_base58_from_bytes((uchar *)&written,0x15,1,output);
        wally_clear_2(local_78,0x41,&written,0x15);
      }
    }
  }
  return wif_local._4_4_;
}

Assistant:

int wally_wif_to_address(const char *wif,
                         uint32_t prefix,
                         uint32_t version,
                         char **output)
{
    int ret;
    unsigned char pubkey[EC_PUBLIC_KEY_UNCOMPRESSED_LEN], address[HASH160_LEN + 1];
    size_t written;

    if (output)
        *output = NULL;

    if (!wif || (prefix & ~0xff) || (version & ~0xff) || !output)
        return WALLY_EINVAL;

    if ((ret = wally_wif_to_public_key(wif, prefix, pubkey, sizeof(pubkey), &written)))
        return ret;

    address[0] = (unsigned char) version & 0xff;

    if ((ret = wally_hash160(pubkey, written, &address[1], HASH160_LEN)))
        return ret;

    ret = wally_base58_from_bytes(address, sizeof(address), BASE58_FLAG_CHECKSUM, output);

    wally_clear_2(pubkey, sizeof(pubkey), address, sizeof(address));
    return ret;
}